

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

Var Js::JavascriptConversion::MethodCallToPrimitive<(Js::JavascriptHint)1>
              (RecyclableObject *value,ScriptContext *requestContext)

{
  code *pcVar1;
  anon_class_32_4_9fc97a1a implicitCall;
  Var checkScriptContext;
  Var scriptContext_00;
  bool bVar2;
  BOOL BVar3;
  ScriptConfiguration *this;
  PropertyRecord *this_00;
  char16 *varName;
  JavascriptLibrary *pJVar4;
  JavascriptFunction *function;
  JavascriptString *pJVar5;
  undefined4 *puVar6;
  ThreadContext *this_01;
  RecyclableObject *pRVar7;
  ThreadContext *threadContext;
  JavascriptString *hintString;
  JavascriptFunction *exoticToPrim;
  Var varMethod;
  ScriptContext *scriptContext;
  Var result;
  ScriptContext *requestContext_local;
  RecyclableObject *value_local;
  ScriptContext *local_20;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  scriptContext = (ScriptContext *)0x0;
  result = requestContext;
  requestContext_local = (ScriptContext *)value;
  varMethod = RecyclableObject::GetScriptContext(value);
  exoticToPrim = (JavascriptFunction *)0x0;
  this = ScriptContext::GetConfig((ScriptContext *)result);
  bVar2 = ScriptConfiguration::IsES6ToPrimitiveEnabled(this);
  if ((((!bVar2) ||
       (bVar2 = Js::JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties
                          ((RecyclableObject *)requestContext_local), bVar2)) ||
      (BVar3 = Js::JavascriptOperators::GetPropertyReference
                         ((RecyclableObject *)requestContext_local,0x1a,&exoticToPrim,
                          (ScriptContext *)result,(PropertyValueInfo *)0x0), BVar3 == 0)) ||
     (BVar3 = Js::JavascriptOperators::IsUndefinedOrNull(exoticToPrim), BVar3 != 0)) {
    value_local = (RecyclableObject *)
                  OrdinaryToPrimitive<(Js::JavascriptHint)1>
                            ((RecyclableObject *)requestContext_local,(ScriptContext *)result);
  }
  else {
    bVar2 = VarIs<Js::JavascriptFunction>(exoticToPrim);
    scriptContext_00 = result;
    checkScriptContext = varMethod;
    if (bVar2) {
      function = UnsafeVarTo<Js::JavascriptFunction>(exoticToPrim);
      pJVar4 = ScriptContext::GetLibrary((ScriptContext *)result);
      pJVar5 = JavascriptLibrary::GetStringTypeDisplayString(pJVar4);
      if (function == (JavascriptFunction *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                    ,0x1f0,"(nullptr != exoticToPrim)","nullptr != exoticToPrim");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_01 = ScriptContext::GetThreadContext((ScriptContext *)result);
      implicitCall.threadContext = this_01;
      implicitCall.value = (RecyclableObject *)requestContext_local;
      implicitCall.exoticToPrim = function;
      implicitCall.hintString = pJVar5;
      scriptContext =
           (ScriptContext *)
           ThreadContext::
           ExecuteImplicitCall<Js::JavascriptConversion::MethodCallToPrimitive<(Js::JavascriptHint)1>(Js::RecyclableObject*,Js::ScriptContext*)::_lambda()_1_>
                     (this_01,(RecyclableObject *)function,ImplicitCall_ToPrimitive,implicitCall);
      if (scriptContext == (ScriptContext *)0x0) {
        bVar2 = ThreadContext::IsDisableImplicitCall(this_01);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                      ,0x1fe,"(threadContext->IsDisableImplicitCall())",
                                      "threadContext->IsDisableImplicitCall()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        pJVar4 = ScriptContext::GetLibrary((ScriptContext *)result);
        value_local = JavascriptLibraryBase::GetNull(&pJVar4->super_JavascriptLibraryBase);
      }
      else {
        BVar3 = CrossSite::NeedMarshalVar(scriptContext,(ScriptContext *)result);
        if (BVar3 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                      ,0x202,"(!CrossSite::NeedMarshalVar(result, requestContext))",
                                      "!CrossSite::NeedMarshalVar(result, requestContext)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        bVar2 = TaggedInt::Is(scriptContext);
        if (!bVar2) {
          local_20 = scriptContext;
          if (scriptContext == (ScriptContext *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          bVar2 = TaggedInt::Is(local_20);
          if (bVar2) {
            local_18 = TypeIds_FirstNumberType;
          }
          else {
            bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(local_20);
            if (bVar2) {
              local_18 = TypeIds_Number;
            }
            else {
              pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_20);
              if (pRStack_10 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 0;
              }
              local_14 = RecyclableObject::GetTypeId(pRStack_10);
              if ((0x57 < (int)local_14) &&
                 (BVar3 = RecyclableObject::IsExternal(pRStack_10), BVar3 == 0)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                            "GetTypeId aValue has invalid TypeId");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 0;
              }
              local_18 = local_14;
            }
          }
          BVar3 = Js::JavascriptOperators::IsObjectType(local_18);
          if (BVar3 != 0) {
            JavascriptError::TryThrowTypeError
                      ((ScriptContext *)varMethod,(ScriptContext *)result,-0x7ff5ec37,
                       L"[Symbol.toPrimitive]");
            pJVar4 = ScriptContext::GetLibrary((ScriptContext *)result);
            pRVar7 = JavascriptLibraryBase::GetNull(&pJVar4->super_JavascriptLibraryBase);
            return pRVar7;
          }
        }
        value_local = (RecyclableObject *)scriptContext;
      }
    }
    else {
      this_00 = ScriptContext::GetPropertyName((ScriptContext *)result,0x1a);
      varName = PropertyRecord::GetBuffer(this_00);
      JavascriptError::TryThrowTypeError
                ((ScriptContext *)checkScriptContext,(ScriptContext *)scriptContext_00,-0x7ff5ec45,
                 varName);
      pJVar4 = ScriptContext::GetLibrary((ScriptContext *)result);
      value_local = JavascriptLibraryBase::GetNull(&pJVar4->super_JavascriptLibraryBase);
    }
  }
  return value_local;
}

Assistant:

Var JavascriptConversion::MethodCallToPrimitive(_In_ RecyclableObject* value, _In_ ScriptContext * requestContext)
    {
        Var result = nullptr;
        ScriptContext *const scriptContext = value->GetScriptContext();

        //7.3.9 GetMethod(V, P)
        //  The abstract operation GetMethod is used to get the value of a specific property of an ECMAScript language value when the value of the
        //  property is expected to be a function. The operation is called with arguments V and P where V is the ECMAScript language value, P is the
        //  property key. This abstract operation performs the following steps:
        //  1. Assert: IsPropertyKey(P) is true.
        //  2. Let func be ? GetV(V, P).
        //  3. If func is either undefined or null, return undefined.
        //  4. If IsCallable(func) is false, throw a TypeError exception.
        //  5. Return func.
        Var varMethod = nullptr;

        if (!requestContext->GetConfig()->IsES6ToPrimitiveEnabled()
            || JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(value)
            || !JavascriptOperators::GetPropertyReference(value, PropertyIds::_symbolToPrimitive, &varMethod, requestContext)
            || JavascriptOperators::IsUndefinedOrNull(varMethod))
        {
            return OrdinaryToPrimitive<hint>(value, requestContext);
        }
        if (!VarIs<JavascriptFunction>(varMethod))
        {
            // Don't error if we disabled implicit calls
            JavascriptError::TryThrowTypeError(scriptContext, requestContext, JSERR_Property_NeedFunction, requestContext->GetPropertyName(PropertyIds::_symbolToPrimitive)->GetBuffer());
            return requestContext->GetLibrary()->GetNull();
        }

        // Let exoticToPrim be GetMethod(input, @@toPrimitive).
        JavascriptFunction* exoticToPrim = UnsafeVarTo<JavascriptFunction>(varMethod);
        JavascriptString* hintString = nullptr;

        if (hint == JavascriptHint::HintString)
        {
            hintString = requestContext->GetLibrary()->GetStringTypeDisplayString();
        }
        else if (hint == JavascriptHint::HintNumber)
        {
            hintString = requestContext->GetLibrary()->GetNumberTypeDisplayString();
        }
        else
        {
            hintString = requestContext->GetPropertyString(PropertyIds::default_);
        }

        // If exoticToPrim is not undefined, then
        Assert(nullptr != exoticToPrim);
        ThreadContext * threadContext = requestContext->GetThreadContext();
        result = threadContext->ExecuteImplicitCall(exoticToPrim, ImplicitCall_ToPrimitive, [=]()->Js::Var
        {
            // Stack object should have a pre-op bail on implicit call.  We shouldn't see them here.
            Assert(!ThreadContext::IsOnStack(value));

            // Let result be the result of calling the[[Call]] internal method of exoticToPrim, with input as thisArgument and(hint) as argumentsList.
            return CALL_FUNCTION(threadContext, exoticToPrim, CallInfo(CallFlags_Value, 2), value, hintString);
        });

        if (!result)
        {
            // There was an implicit call and implicit calls are disabled. This would typically cause a bailout.
            Assert(threadContext->IsDisableImplicitCall());
            return requestContext->GetLibrary()->GetNull();
        }

        Assert(!CrossSite::NeedMarshalVar(result, requestContext));
        // If result is an ECMAScript language value and Type(result) is not Object, then return result.
        if (TaggedInt::Is(result) || !JavascriptOperators::IsObjectType(JavascriptOperators::GetTypeId(result)))
        {
            return result;
        }
        // Else, throw a TypeError exception.
        else
        {
            // Don't error if we disabled implicit calls
            JavascriptError::TryThrowTypeError(scriptContext, requestContext, JSERR_FunctionArgument_Invalid, _u("[Symbol.toPrimitive]"));
            return requestContext->GetLibrary()->GetNull();
        }
    }